

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtextures.c
# Opt level: O2

void ImageAlphaPremultiply(Image *image)

{
  byte bVar1;
  int newFormat;
  Color *pCVar2;
  int i;
  long lVar3;
  float fVar4;
  
  if (((image->data != (void *)0x0) && (image->width != 0)) && (image->height != 0)) {
    pCVar2 = LoadImageColors(*image);
    for (lVar3 = 0; lVar3 < (long)image->height * (long)image->width; lVar3 = lVar3 + 1) {
      bVar1 = pCVar2[lVar3].a;
      if (bVar1 != 0xff) {
        if (bVar1 == 0) {
          pCVar2[lVar3].r = '\0';
          pCVar2[lVar3].g = '\0';
          pCVar2[lVar3].b = '\0';
        }
        else {
          fVar4 = (float)bVar1 / 255.0;
          pCVar2[lVar3].r = (uchar)(int)((float)pCVar2[lVar3].r * fVar4);
          pCVar2[lVar3].g = (uchar)(int)((float)pCVar2[lVar3].g * fVar4);
          pCVar2[lVar3].b = (uchar)(int)((float)pCVar2[lVar3].b * fVar4);
        }
      }
    }
    free(image->data);
    newFormat = image->format;
    image->data = pCVar2;
    image->format = 7;
    ImageFormat(image,newFormat);
    return;
  }
  return;
}

Assistant:

void ImageAlphaPremultiply(Image *image)
{
    // Security check to avoid program crash
    if ((image->data == NULL) || (image->width == 0) || (image->height == 0)) return;

    float alpha = 0.0f;
    Color *pixels = LoadImageColors(*image);

    for (int i = 0; i < image->width*image->height; i++)
    {
        if (pixels[i].a == 0)
        {
            pixels[i].r = 0;
            pixels[i].g = 0;
            pixels[i].b = 0;
        }
        else if (pixels[i].a < 255)
        {
            alpha = (float)pixels[i].a/255.0f;
            pixels[i].r = (unsigned char)((float)pixels[i].r*alpha);
            pixels[i].g = (unsigned char)((float)pixels[i].g*alpha);
            pixels[i].b = (unsigned char)((float)pixels[i].b*alpha);
        }
    }

    RL_FREE(image->data);

    int format = image->format;
    image->data = pixels;
    image->format = PIXELFORMAT_UNCOMPRESSED_R8G8B8A8;

    ImageFormat(image, format);
}